

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fibonacci.cpp
# Opt level: O0

Executor * get_executor(void)

{
  int iVar1;
  uint uVar2;
  shared_ptr<tf::WorkerInterface> *in_stack_000000b8;
  size_t in_stack_000000c0;
  Executor *in_stack_000000c8;
  nullptr_t in_stack_ffffffffffffffc8;
  
  if (get_executor()::executor == '\0') {
    iVar1 = __cxa_guard_acquire(&get_executor()::executor);
    if (iVar1 != 0) {
      uVar2 = std::thread::hardware_concurrency();
      std::shared_ptr<tf::WorkerInterface>::shared_ptr
                ((shared_ptr<tf::WorkerInterface> *)(ulong)uVar2,in_stack_ffffffffffffffc8);
      tf::Executor::Executor(in_stack_000000c8,in_stack_000000c0,in_stack_000000b8);
      std::shared_ptr<tf::WorkerInterface>::~shared_ptr((shared_ptr<tf::WorkerInterface> *)0x1058bf)
      ;
      __cxa_atexit(tf::Executor::~Executor,&get_executor::executor,&__dso_handle);
      __cxa_guard_release(&get_executor()::executor);
    }
  }
  return &get_executor::executor;
}

Assistant:

tf::Executor& get_executor() {
  static tf::Executor executor;
  return executor;
}